

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_probv(ngram_model_t *model,char *word,...)

{
  char in_AL;
  uint uVar1;
  int32 iVar2;
  int32 *history_00;
  undefined8 *puVar3;
  undefined8 in_RCX;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  undefined8 in_RDX;
  size_t n_elem;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list history;
  int32 n_used;
  long local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  local_d8[2] = in_RDX;
  local_d8[3] = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  plVar4 = (long *)&stack0x00000008;
  uVar1 = 0x10;
  n_elem = 0xffffffffffffffff;
  do {
    if (uVar1 < 0x29) {
      uVar5 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      plVar6 = (long *)((long)local_d8 + uVar5);
    }
    else {
      plVar6 = plVar4;
      plVar4 = plVar4 + 1;
    }
    n_elem = n_elem + 1;
  } while (*plVar6 != 0);
  history_00 = (int32 *)__ckd_calloc__(n_elem,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                       ,0x1f5);
  uVar1 = 0x10;
  history[0].overflow_arg_area = &stack0x00000008;
  lVar7 = 0;
  while( true ) {
    uVar5 = (ulong)uVar1;
    if (uVar5 < 0x29) {
      uVar1 = uVar1 + 8;
      puVar3 = (undefined8 *)((long)local_d8 + uVar5);
    }
    else {
      puVar3 = (undefined8 *)history[0].overflow_arg_area;
      history[0].overflow_arg_area = (void *)((long)history[0].overflow_arg_area + 8);
    }
    if ((char *)*puVar3 == (char *)0x0) break;
    iVar2 = ngram_wid(model,(char *)*puVar3);
    history_00[lVar7] = iVar2;
    lVar7 = lVar7 + 1;
  }
  iVar2 = ngram_wid(model,word);
  iVar2 = ngram_ng_prob(model,iVar2,history_00,(int32)lVar7,&n_used);
  ckd_free(history_00);
  return iVar2;
}

Assistant:

int32
ngram_probv(ngram_model_t * model, const char *word, ...)
{
    va_list history;
    const char *hword;
    int32 *histid;
    int32 n_hist;
    int32 n_used;
    int32 prob;

    va_start(history, word);
    n_hist = 0;
    while ((hword = va_arg(history, const char *)) != NULL)
        ++n_hist;
    va_end(history);

    histid = ckd_calloc(n_hist, sizeof(*histid));
    va_start(history, word);
    n_hist = 0;
    while ((hword = va_arg(history, const char *)) != NULL) {
        histid[n_hist] = ngram_wid(model, hword);
        ++n_hist;
    }
    va_end(history);

    prob = ngram_ng_prob(model, ngram_wid(model, word),
                         histid, n_hist, &n_used);
    ckd_free(histid);
    return prob;
}